

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O2

pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::pop
          (UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_> *this)

{
  _Elt_pointer ppVar1;
  undefined8 uVar2;
  bool bVar3;
  mapped_type *pmVar4;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> pVar5;
  undefined1 auStack_38 [8];
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> item;
  
  do {
    bVar3 = empty(this);
    if (bVar3) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,
                    "T wasm::UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock *, unsigned int>>::pop() [T = std::pair<wasm::LocalGraphFlower::FlowBlock *, unsigned int>]"
                   );
    }
    ppVar1 = (this->data).c.
             super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    auStack_38 = (undefined1  [8])ppVar1->first;
    uVar2 = *(undefined8 *)&ppVar1->second;
    item.first._0_4_ = (undefined4)uVar2;
    item.first._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    pmVar4 = std::__detail::
             _Map_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,(key_type *)auStack_38);
    *pmVar4 = *pmVar4 - 1;
    std::
    deque<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ::pop_front((deque<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                 *)this);
    pmVar4 = std::__detail::
             _Map_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,(key_type *)auStack_38);
  } while (*pmVar4 != 0);
  pVar5.second = item.first._0_4_;
  pVar5.first = (FlowBlock *)auStack_38;
  pVar5._12_4_ = 0;
  return pVar5;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }